

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::SimpleTypeHandler<6UL>::SimpleTypeHandler
          (SimpleTypeHandler<6UL> *this,SimpleTypeHandler<6UL> *typeHandler)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SimplePropertyDescriptor *local_28;
  int local_1c;
  int i;
  SimpleTypeHandler<6UL> *typeHandler_local;
  SimpleTypeHandler<6UL> *this_local;
  
  DynamicTypeHandler::DynamicTypeHandler
            (&this->super_DynamicTypeHandler,&typeHandler->super_DynamicTypeHandler);
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e4df68
  ;
  local_28 = this->descriptors;
  do {
    SimplePropertyDescriptor::SimplePropertyDescriptor(local_28);
    local_28 = local_28 + 1;
  } while ((SimpleTypeHandler<6UL> *)local_28 != this + 1);
  bVar2 = DynamicTypeHandler::GetIsInlineSlotCapacityLocked(&typeHandler->super_DynamicTypeHandler);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x1d,"(typeHandler->GetIsInlineSlotCapacityLocked())",
                                "typeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  for (local_1c = 0; local_1c < this->propertyCount; local_1c = local_1c + 1) {
    SimplePropertyDescriptor::operator=
              (this->descriptors + local_1c,typeHandler->descriptors + local_1c);
  }
  return;
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(SimpleTypeHandler<size> * typeHandler) :
        DynamicTypeHandler(typeHandler)
    {
        Assert(typeHandler->GetIsInlineSlotCapacityLocked());
        SetIsInlineSlotCapacityLocked();
        for (int i = 0; i < propertyCount; i++)
        {
            descriptors[i] = typeHandler->descriptors[i];
        }
    }